

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

size_t count_textures(aiScene *scene)

{
  aiMaterial *pMat;
  uint uVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = 0;
  for (uVar3 = 0; uVar3 < scene->mNumMaterials; uVar3 = uVar3 + 1) {
    pMat = scene->mMaterials[uVar3];
    for (lVar2 = -0x11; lVar2 != 0; lVar2 = lVar2 + 1) {
      uVar1 = aiGetMaterialTextureCount(pMat,(int)lVar2 + aiTextureType_UNKNOWN);
      sVar4 = (sVar4 + 1) - (ulong)(uVar1 == 0);
    }
  }
  return sVar4;
}

Assistant:

size_t count_textures(const aiScene* scene) {
    size_t count = 0;
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        for (
            size_t tt = aiTextureType_DIFFUSE;
            tt < aiTextureType_UNKNOWN;
            ++tt
        ){
            // TODO: handle layered textures
            if (mat->GetTextureCount(static_cast<aiTextureType>(tt)) > 0) {
                count += 1;
            }
        }
    }
    return count;
}